

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall hdc::TypeCheckerVisitor::visit(TypeCheckerVisitor *this,TimesExpression *expression)

{
  Expression *pEVar1;
  TypeCheckerVisitor *this_00;
  Type *pTVar2;
  
  pEVar1 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  pTVar2 = this->lastType;
  this_00 = (TypeCheckerVisitor *)BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(((Statement *)&this_00->super_Visitor)->super_ASTNode)._vptr_ASTNode)(this_00,this);
  pTVar2 = typeCoercion(this_00,pTVar2,this->lastType);
  Expression::setType((Expression *)expression,pTVar2);
  this->lastType = pTVar2;
  return;
}

Assistant:

void TypeCheckerVisitor::visit(TimesExpression* expression) {
    Type* left;
    Type* right;
    Type* type;

    expression->getLeft()->accept(this);
    left = lastType;

    expression->getRight()->accept(this);
    right = lastType;

    type = typeCoercion(left, right);
    expression->setType(type);
    lastType = type;
}